

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int jrtplib::GetIPv4SocketPort(SocketType s,uint16_t *pPort)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int type;
  uint length;
  uint size;
  sockaddr_in addr;
  int local_34 [3];
  sockaddr local_28;
  
  if (pPort != (uint16_t *)0x0) {
    local_28.sa_family = 0;
    local_28.sa_data[0] = '\0';
    local_28.sa_data[1] = '\0';
    local_28.sa_data[2] = '\0';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\0';
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_34[2] = 0x10;
    iVar2 = getsockname(s,&local_28,(socklen_t *)(local_34 + 2));
    iVar3 = -0x9b;
    if ((iVar2 == 0) && (iVar3 = -0x9c, local_28.sa_family == 2)) {
      uVar1 = local_28.sa_data._0_2_;
      if (local_28.sa_data._0_2_ == 0) {
        iVar3 = -0x9d;
      }
      else {
        local_34[0] = 0;
        local_34[1] = 4;
        iVar2 = getsockopt(s,1,3,local_34,(socklen_t *)(local_34 + 1));
        iVar3 = -0x9e;
        if ((iVar2 == 0) && (iVar3 = -0x9f, local_34[0] == 2)) {
          *pPort = uVar1 << 8 | (ushort)uVar1 >> 8;
          iVar3 = 0;
        }
      }
    }
    return iVar3;
  }
  __assert_fail("pPort != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astronautlabs[P]rtp/src/rtpudpv4transmitter.cpp"
                ,0x86,"int jrtplib::GetIPv4SocketPort(SocketType, uint16_t *)");
}

Assistant:

static int GetIPv4SocketPort(SocketType s, uint16_t *pPort)
{
	assert(pPort != 0);

	struct sockaddr_in addr;
	memset(&addr, 0, sizeof(struct sockaddr_in));

	RTPSOCKLENTYPE size = sizeof(struct sockaddr_in);
	if (getsockname(s,(struct sockaddr*)&addr,&size) != 0)
		return ERR_RTP_UDPV4TRANS_CANTGETSOCKETPORT;

	if (addr.sin_family != AF_INET)
		return ERR_RTP_UDPV4TRANS_NOTANIPV4SOCKET;

	uint16_t port = ntohs(addr.sin_port);
	if (port == 0)
		return ERR_RTP_UDPV4TRANS_SOCKETPORTNOTSET;
	
	int type = 0;
	RTPSOCKLENTYPE length = sizeof(type);

	if (getsockopt(s, SOL_SOCKET, SO_TYPE, (char*)&type, &length) != 0)
		return ERR_RTP_UDPV4TRANS_CANTGETSOCKETTYPE;

	if (type != SOCK_DGRAM)
		return ERR_RTP_UDPV4TRANS_INVALIDSOCKETTYPE;

	*pPort = port;
	return 0;
}